

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::DefaultPerformanceTrackingCallback::handle
          (DefaultPerformanceTrackingCallback *this,PerformanceTrackingData *data)

{
  PerformanceTrackingData *pPVar1;
  ostream *poVar2;
  ostream *poVar3;
  Writer *this_00;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  Writer local_210;
  stringstream_t ss;
  ostream local_190 [376];
  
  this->m_data = data;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = local_190;
  if (*(short *)(this->m_data + 0x28) == 2) {
    poVar2 = std::operator<<(poVar2,"Executed [");
    poVar2 = std::operator<<(poVar2,*(char **)(*(long *)this->m_data + 0x18));
    poVar2 = std::operator<<(poVar2,"] in [");
    poVar2 = std::operator<<(poVar2,(string *)(this->m_data + 8));
    pcVar4 = "]";
  }
  else {
    std::operator<<(poVar2,"Performance checkpoint");
    std::__cxx11::string::string((string *)&local_210,(string *)(this->m_data + 0x30));
    std::__cxx11::string::~string((string *)&local_210);
    if (CONCAT62(local_210._10_6_,local_210.m_level) != 0) {
      poVar3 = std::operator<<(poVar2," [");
      std::__cxx11::string::string((string *)&local_210,(string *)(this->m_data + 0x30));
      poVar3 = std::operator<<(poVar3,(char *)local_210._vptr_Writer);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string((string *)&local_210);
    }
    poVar3 = std::operator<<(poVar2," for block [");
    poVar3 = std::operator<<(poVar3,*(char **)(*(long *)this->m_data + 0x18));
    poVar3 = std::operator<<(poVar3,"] : [");
    (**(code **)(*(long *)(*(long *)this->m_data + 0x10) + 0x10))
              (*(long *)this->m_data + 0x10,poVar3);
    pcVar4 = "]";
    if (((*(byte *)(elStorage + 0x21) & 1) == 0) &&
       (*(char *)(*(long *)this->m_data + 100) == '\x01')) {
      poVar3 = std::operator<<(poVar2," ([");
      poVar3 = std::operator<<(poVar3,(string *)(this->m_data + 8));
      std::operator<<(poVar3,"] from ");
      if (*(long *)(*(long *)this->m_data + 0x70) == 0) {
        pcVar4 = "last checkpoint";
        poVar3 = poVar2;
      }
      else {
        poVar3 = std::operator<<(poVar2,"checkpoint \'");
        poVar3 = std::operator<<(poVar3,*(char **)(*(long *)this->m_data + 0x68));
        pcVar4 = "\'";
      }
      std::operator<<(poVar3,pcVar4);
      pcVar4 = ")]";
    }
  }
  std::operator<<(poVar2,pcVar4);
  pPVar1 = this->m_data;
  local_210.m_level = *(Level *)(*(long *)pPVar1 + 0x62);
  local_210.m_file = *(char **)(pPVar1 + 0x50);
  local_210.m_line = *(unsigned_long *)(pPVar1 + 0x58);
  local_210.m_func = *(char **)(pPVar1 + 0x60);
  local_210._vptr_Writer = (_func_int **)&PTR__Writer_00132900;
  local_210.m_verboseLevel = 0;
  local_210.m_proceed = false;
  local_210.m_messageBuilder.m_logger = (Logger *)0x0;
  local_210.m_messageBuilder.m_containerLogSeperator = "";
  local_210.m_dispatchAction = NormalLog;
  local_210.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = Writer::construct(&local_210,1,*(char **)(*(long *)pPVar1 + 0x40));
  std::__cxx11::stringbuf::str();
  Writer::operator<<(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  Writer::~Writer(&local_210);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void handle(const PerformanceTrackingData* data) {
        m_data = data;
        base::type::stringstream_t ss;
        if (m_data->dataType() == PerformanceTrackingData::DataType::Complete) {
            ss << ELPP_LITERAL("Executed [") << m_data->blockName()->c_str() << ELPP_LITERAL("] in [") << *m_data->formattedTimeTaken() << ELPP_LITERAL("]");
        } else {
            ss << ELPP_LITERAL("Performance checkpoint");
            if (!m_data->checkpointId().empty()) {
                ss << ELPP_LITERAL(" [") << m_data->checkpointId().c_str() << ELPP_LITERAL("]");
            }
            ss << ELPP_LITERAL(" for block [") << m_data->blockName()->c_str() << ELPP_LITERAL("] : [") << *m_data->performanceTracker();
            if (!ELPP->hasFlag(LoggingFlag::DisablePerformanceTrackingCheckpointComparison) && m_data->performanceTracker()->m_hasChecked) {
                ss << ELPP_LITERAL(" ([") << *m_data->formattedTimeTaken() << ELPP_LITERAL("] from ");
                if (m_data->performanceTracker()->m_lastCheckpointId.empty()) {
                    ss << ELPP_LITERAL("last checkpoint");
                } else {
                    ss << ELPP_LITERAL("checkpoint '") << m_data->performanceTracker()->m_lastCheckpointId.c_str() << ELPP_LITERAL("'");
                }
                ss << ELPP_LITERAL(")]");
            } else {
                ss << ELPP_LITERAL("]");
            }
        }
        el::base::Writer(m_data->performanceTracker()->level(), m_data->file(), m_data->line(), m_data->func()).construct(1, m_data->loggerId().c_str()) << ss.str();
    }